

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_constraints.cpp
# Opt level: O0

void duckdb::ExtractReferencedColumns
               (ParsedExpression *expr,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               *result)

{
  ExpressionClass EVar1;
  value_type *in_RSI;
  BaseExpression *in_RDI;
  ColumnRefExpression *colref;
  value_type *in_stack_ffffffffffffffa8;
  function<void_(const_duckdb::ParsedExpression_&)> *in_stack_ffffffffffffffb0;
  function<void_(const_duckdb::ParsedExpression_&)> *in_stack_ffffffffffffffd8;
  BaseExpression *in_stack_ffffffffffffffe0;
  
  EVar1 = BaseExpression::GetExpressionClass(in_RDI);
  if (EVar1 == COLUMN_REF) {
    BaseExpression::Cast<duckdb::ColumnRefExpression>(in_stack_ffffffffffffffe0);
    ColumnRefExpression::GetColumnName_abi_cxx11_((ColumnRefExpression *)0x140415f);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffffffb0,in_RSI);
    in_stack_ffffffffffffffa8 = in_RSI;
  }
  ::std::function<void(duckdb::ParsedExpression_const&)>::
  function<duckdb::ExtractReferencedColumns(duckdb::ParsedExpression_const&,duckdb::vector<std::__cxx11::string,true>&)::__0,void>
            (in_stack_ffffffffffffffb0,(anon_class_8_1_6971b95b *)in_stack_ffffffffffffffa8);
  ParsedExpressionIterator::EnumerateChildren
            ((ParsedExpression *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  ::std::function<void_(const_duckdb::ParsedExpression_&)>::~function
            ((function<void_(const_duckdb::ParsedExpression_&)> *)0x14041ad);
  return;
}

Assistant:

void ExtractReferencedColumns(const ParsedExpression &expr, vector<string> &result) {
	if (expr.GetExpressionClass() == ExpressionClass::COLUMN_REF) {
		auto &colref = expr.Cast<ColumnRefExpression>();
		result.push_back(colref.GetColumnName());
	}
	ParsedExpressionIterator::EnumerateChildren(
	    expr, [&](const ParsedExpression &child) { ExtractReferencedColumns(child, result); });
}